

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O1

void PCorr(double *in,double *outcorr)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  
  __x = 1e-13;
  dVar7 = 0.0;
  lVar1 = 0;
  do {
    dVar5 = in[lVar1];
    __x = __x + dVar5 * dVar5;
    dVar7 = dVar7 + dVar5 * in[lVar1 + 0x48];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3c);
  pdVar3 = outcorr + 0x40;
  if (__x < 0.0) {
    dVar5 = sqrt(__x);
  }
  else {
    dVar5 = SQRT(__x);
  }
  *pdVar3 = dVar7 / dVar5;
  pdVar4 = in + 2;
  lVar1 = 1;
  do {
    dVar7 = in[0x48] * in[lVar1];
    dVar5 = 0.0;
    lVar2 = 0;
    do {
      dVar5 = dVar5 + dVar7;
      dVar7 = in[lVar2 + 0x49] * pdVar4[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x3b);
    __x = in[lVar1 + 0x3b] * in[lVar1 + 0x3b] + __x + -in[lVar1 + -1] * in[lVar1 + -1];
    if (__x < 0.0) {
      dVar6 = sqrt(__x);
    }
    else {
      dVar6 = SQRT(__x);
    }
    pdVar3 = pdVar3 + -1;
    *pdVar3 = (dVar7 + dVar5) / dVar6;
    lVar1 = lVar1 + 1;
    pdVar4 = pdVar4 + 1;
  } while (lVar1 != 0x41);
  return;
}

Assistant:

static void PCorr(const double *in, double *outcorr)
{
  double sum, ysum, prod;
  const double *x, *inptr;
  int k, n;

  //ysum = 1e-6;          /* use this with float (i.s.o. double)! */
  ysum = 1e-13;
  sum = 0.0;
  x = in + PITCH_MAX_LAG/2 + 2;
  for (n = 0; n < PITCH_CORR_LEN2; n++) {
    ysum += in[n] * in[n];
    sum += x[n] * in[n];
  }

  outcorr += PITCH_LAG_SPAN2 - 1;     /* index of last element in array */
  *outcorr = sum / sqrt(ysum);

  for (k = 1; k < PITCH_LAG_SPAN2; k++) {
    ysum -= in[k-1] * in[k-1];
    ysum += in[PITCH_CORR_LEN2 + k - 1] * in[PITCH_CORR_LEN2 + k - 1];
    sum = 0.0;
    inptr = &in[k];
    prod = x[0] * inptr[0];
    for (n = 1; n < PITCH_CORR_LEN2; n++) {
      sum += prod;
      prod = x[n] * inptr[n];
    }
    sum += prod;
    outcorr--;
    *outcorr = sum / sqrt(ysum);
  }
}